

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.cpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
* __thiscall
(anonymous_namespace)::option_string_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
           *__return_storage_ptr__,_anonymous_namespace_ *this,option *op)

{
  byte bVar1;
  string *str_00;
  size_t sVar2;
  char *local_c0;
  czstring desc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string str;
  size_t code_points;
  string *name;
  option *op_local;
  
  str_00 = pstore::command_line::option::name_abi_cxx11_((option *)this);
  str.field_2._8_8_ = pstore::utf::length(str_00);
  std::__cxx11::string::string((string *)local_48);
  if ((ulong)str.field_2._8_8_ < 2) {
    std::operator+(&local_68,"-",str_00);
    std::__cxx11::string::operator=((string *)local_48,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    str.field_2._8_8_ = str.field_2._8_8_ + 1;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&desc,"--",
                   str_00);
    std::__cxx11::string::operator=((string *)local_48,(string *)&desc);
    std::__cxx11::string::~string((string *)&desc);
    str.field_2._8_8_ = str.field_2._8_8_ + 2;
  }
  bVar1 = (**(code **)(*(long *)this + 0x70))();
  if ((bVar1 & 1) == 0) {
    local_c0 = (char *)0x0;
  }
  else {
    local_c0 = (char *)(**(code **)(*(long *)this + 0x88))();
  }
  if (local_c0 != (char *)0x0) {
    if (2 < (ulong)str.field_2._8_8_) {
      std::__cxx11::string::operator+=((string *)local_48,"=");
      str.field_2._8_8_ = str.field_2._8_8_ + 1;
    }
    std::__cxx11::string::operator+=((string *)local_48,'<');
    std::__cxx11::string::operator+=((string *)local_48,local_c0);
    std::__cxx11::string::operator+=((string *)local_48,'>');
    sVar2 = pstore::utf::length(local_c0);
    str.field_2._8_8_ = sVar2 + 2 + str.field_2._8_8_;
  }
  sVar2 = pstore::utf::length((string *)local_48);
  if (sVar2 == str.field_2._8_8_) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_long_&,_true>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
               (unsigned_long *)(str.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_48);
    return __return_storage_ptr__;
  }
  pstore::assert_failed
            ("pstore::utf::length (str) == code_points",
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/command_line/help.cpp"
             ,0x56);
}

Assistant:

auto option_string (pstore::command_line::option const & op)
        -> std::pair<std::string, std::size_t> {

        std::string const & name = op.name ();
        std::size_t code_points = pstore::utf::length (name);

        std::string str;
        if (code_points < 2U) {
            str = "-" + name;
            code_points += 1U;
        } else {
            str = "--" + name;
            code_points += 2U;
        }

        // Add the argument value's meta-name.
        pstore::gsl::czstring const desc = op.takes_argument () ? op.arg_description () : nullptr;
        if (desc != nullptr) {
            if (code_points > 2U) {
                str += "=";
                ++code_points;
            }
            str += '<';
            str += desc;
            str += '>';
            code_points += pstore::utf::length (desc) + 2;
        }
        PSTORE_ASSERT (pstore::utf::length (str) == code_points);
        return {str, code_points};
    }